

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ParseAction(JSONParser *this,Action *out_action)

{
  bool bVar1;
  Result RVar2;
  ActionType AVar3;
  
  RVar2 = ExpectKey(this,"action");
  if (((RVar2.enum_ != Error) && (RVar2 = Expect(this,"{"), RVar2.enum_ != Error)) &&
     (RVar2 = ExpectKey(this,"type"), RVar2.enum_ != Error)) {
    bVar1 = Match(this,"\"invoke\"");
    AVar3 = Invoke;
    if (!bVar1) {
      RVar2 = Expect(this,"\"get\"");
      AVar3 = Get;
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
    }
    out_action->type = AVar3;
    RVar2 = Expect(this,",");
    if ((RVar2.enum_ != Error) &&
       (((bVar1 = Match(this,"\"module\""), !bVar1 ||
         (((RVar2 = Expect(this,":"), RVar2.enum_ != Error &&
           (RVar2 = ParseString(this,&out_action->module_name), RVar2.enum_ != Error)) &&
          (RVar2 = Expect(this,","), RVar2.enum_ != Error)))) &&
        (RVar2 = ParseKeyStringValue(this,"field",&out_action->field_name), RVar2.enum_ != Error))))
    {
      if (out_action->type == Invoke) {
        RVar2 = Expect(this,",");
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        RVar2 = ExpectKey(this,"args");
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
        RVar2 = ParseConstVector(this,&out_action->types,&out_action->args);
        if (RVar2.enum_ == Error) {
          return (Result)Error;
        }
      }
      RVar2 = Expect(this,"}");
      return (Result)(uint)(RVar2.enum_ == Error);
    }
  }
  return (Result)Error;
}

Assistant:

wabt::Result JSONParser::ParseAction(Action* out_action) {
  EXPECT_KEY("action");
  EXPECT("{");
  EXPECT_KEY("type");
  if (Match("\"invoke\"")) {
    out_action->type = ActionType::Invoke;
  } else {
    EXPECT("\"get\"");
    out_action->type = ActionType::Get;
  }
  EXPECT(",");
  if (Match("\"module\"")) {
    EXPECT(":");
    CHECK_RESULT(ParseString(&out_action->module_name));
    EXPECT(",");
  }
  PARSE_KEY_STRING_VALUE("field", &out_action->field_name);
  if (out_action->type == ActionType::Invoke) {
    EXPECT(",");
    EXPECT_KEY("args");
    CHECK_RESULT(ParseConstVector(&out_action->types, &out_action->args));
  }
  EXPECT("}");
  return wabt::Result::Ok;
}